

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConn.cpp
# Opt level: O0

BufferChain * __thiscall TcpConn::Alloc(TcpConn *this)

{
  BufferPool *this_00;
  BufferChain *this_01;
  BufferChain *bc;
  TcpConn *this_local;
  
  this_00 = Poller::BuffPool((this->super_PollObj).m_pPoller);
  this_01 = MemPoolC<BufferChain,_4096>::Get(this_00,0x1000);
  BufferChain::Init(this_01);
  return this_01;
}

Assistant:

BufferChain* TcpConn::Alloc()
{
    auto* bc = this->m_pPoller->BuffPool().Get();
    bc->Init();
    return bc;
}